

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vardata.c
# Opt level: O1

int vardata_validate(vardata *data)

{
  vardata_variant *pvVar1;
  vardata_mode *pvVar2;
  int *piVar3;
  uint uVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  void *pvVar7;
  vardata_feature *pvVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint32_t **ppuVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  long local_48;
  
  if (data->validated != 0) {
    abort();
  }
  data->validated = 1;
  uVar10 = data->featuresnum;
  if (0 < (int)uVar10) {
    uVar15 = (ulong)uVar10 + 0x1f >> 5;
    ppuVar12 = &data->features->cfmask;
    uVar16 = 0;
    do {
      puVar5 = (uint32_t *)calloc(4,uVar15);
      ppuVar12[-1] = puVar5;
      puVar6 = (uint32_t *)calloc(4,uVar15);
      *ppuVar12 = puVar6;
      puVar5[uVar16 >> 5 & 0x7ffffff] = puVar5[uVar16 >> 5 & 0x7ffffff] | 1 << ((byte)uVar16 & 0x1f)
      ;
      uVar16 = uVar16 + 1;
      ppuVar12 = ppuVar12 + 8;
    } while (uVar10 != uVar16);
  }
  iVar11 = data->variantsnum;
  if (0 < (long)iVar11) {
    iVar9 = uVar10 + 0x3e;
    if (-1 < (int)(uVar10 + 0x1f)) {
      iVar9 = uVar10 + 0x1f;
    }
    pvVar1 = data->variants;
    lVar13 = 0;
    do {
      pvVar7 = calloc(4,(long)(iVar9 >> 5));
      *(void **)((long)&pvVar1->fmask + lVar13) = pvVar7;
      lVar13 = lVar13 + 0x30;
    } while ((long)iVar11 * 0x30 != lVar13);
  }
  iVar11 = data->modesnum;
  if (0 < (long)iVar11) {
    iVar9 = uVar10 + 0x3e;
    if (-1 < (int)(uVar10 + 0x1f)) {
      iVar9 = uVar10 + 0x1f;
    }
    pvVar2 = data->modes;
    lVar13 = 0;
    do {
      pvVar7 = calloc(4,(long)(iVar9 >> 5));
      *(void **)((long)&pvVar2->rfmask + lVar13) = pvVar7;
      lVar13 = lVar13 + 0x30;
    } while ((long)iVar11 * 0x30 != lVar13);
  }
  if (0 < data->featuresnum) {
    uVar15 = 0;
    do {
      pvVar8 = data->features;
      if (0 < pvVar8[uVar15].impliesnum) {
        local_48 = 0;
        do {
          uVar16 = (ulong)(uint)data->featuresnum;
          if (0 < data->featuresnum) {
            iVar11 = pvVar8[uVar15].implies[local_48];
            lVar17 = 0x10;
            lVar13 = 0;
            do {
              puVar5 = *(uint32_t **)((long)&data->features->name + lVar17);
              if ((puVar5[uVar15 >> 5 & 0x7ffffff] & 1 << ((byte)uVar15 & 0x1f)) != 0) {
                mask_or(puVar5,data->features[iVar11].ifmask,(int)uVar16);
              }
              lVar13 = lVar13 + 1;
              uVar16 = (ulong)data->featuresnum;
              lVar17 = lVar17 + 0x40;
            } while (lVar13 < (long)uVar16);
          }
          local_48 = local_48 + 1;
          pvVar8 = data->features;
        } while (local_48 < pvVar8[uVar15].impliesnum);
      }
      uVar15 = uVar15 + 1;
    } while ((long)uVar15 < (long)data->featuresnum);
  }
  if (0 < data->featuresnum) {
    pvVar8 = data->features;
    uVar15 = 0;
    do {
      if (0 < pvVar8[uVar15].conflictsnum) {
        puVar5 = pvVar8[uVar15].cfmask;
        piVar3 = pvVar8[uVar15].conflicts;
        lVar13 = 0;
        do {
          iVar11 = piVar3[lVar13];
          iVar9 = iVar11 + 0x1f;
          if (-1 < iVar11) {
            iVar9 = iVar11;
          }
          puVar5[iVar9 >> 5] = puVar5[iVar9 >> 5] | 1 << ((byte)iVar11 & 0x1f);
          pvVar8[iVar11].cfmask[uVar15 >> 5 & 0x7ffffff] =
               pvVar8[iVar11].cfmask[uVar15 >> 5 & 0x7ffffff] | 1 << ((byte)uVar15 & 0x1f);
          lVar13 = lVar13 + 1;
        } while (lVar13 < pvVar8[uVar15].conflictsnum);
      }
      uVar15 = uVar15 + 1;
    } while ((long)uVar15 < (long)data->featuresnum);
  }
  do {
    if (data->featuresnum < 1) break;
    lVar13 = 0;
    uVar10 = 0;
    do {
      uVar15 = (ulong)(uint)data->featuresnum;
      if (0 < data->featuresnum) {
        lVar17 = 0x18;
        uVar16 = 0;
        do {
          pvVar8 = data->features;
          if ((pvVar8[lVar13].ifmask[uVar16 >> 5 & 0x7ffffff] >> ((uint)uVar16 & 0x1f) & 1) != 0) {
            uVar4 = mask_or_r(pvVar8[lVar13].cfmask,*(uint32_t **)((long)&pvVar8->name + lVar17),
                              (int)uVar15);
            uVar10 = uVar10 | uVar4;
          }
          uVar16 = uVar16 + 1;
          uVar15 = (ulong)data->featuresnum;
          lVar17 = lVar17 + 0x40;
        } while ((long)uVar16 < (long)uVar15);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < data->featuresnum);
  } while (uVar10 != 0);
  if (data->featuresnum < 1) {
    iVar11 = 0;
  }
  else {
    lVar13 = 0;
    uVar15 = 0;
    iVar11 = 0;
    do {
      if ((*(uint *)(*(long *)((long)&data->features->cfmask + lVar13) +
                    (uVar15 >> 5 & 0x7ffffff) * 4) >> ((uint)uVar15 & 0x1f) & 1) != 0) {
        fprintf(_stderr,"vardata %s: feature %s conflicts with itself!\n",data->name,
                *(undefined8 *)((long)&data->features->name + lVar13));
        iVar11 = 1;
      }
      uVar15 = uVar15 + 1;
      lVar13 = lVar13 + 0x40;
    } while ((long)uVar15 < (long)data->featuresnum);
  }
  if (0 < data->variantsnum) {
    lVar13 = 0;
    do {
      pvVar1 = data->variants;
      if (0 < pvVar1[lVar13].featuresnum) {
        lVar17 = 0;
        do {
          mask_or(pvVar1[lVar13].fmask,data->features[pvVar1[lVar13].features[lVar17]].ifmask,
                  data->featuresnum);
          lVar17 = lVar17 + 1;
          pvVar1 = data->variants;
        } while (lVar17 < pvVar1[lVar13].featuresnum);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < data->variantsnum);
  }
  if (0 < data->modesnum) {
    pvVar2 = data->modes;
    lVar13 = 0;
    do {
      if (0 < pvVar2[lVar13].rfeaturesnum) {
        puVar5 = pvVar2[lVar13].rfmask;
        piVar3 = pvVar2[lVar13].rfeatures;
        lVar17 = 0;
        do {
          iVar9 = piVar3[lVar17];
          iVar14 = iVar9 + 0x1f;
          if (-1 < iVar9) {
            iVar14 = iVar9;
          }
          puVar5[iVar14 >> 5] = puVar5[iVar14 >> 5] | 1 << ((byte)iVar9 & 0x1f);
          lVar17 = lVar17 + 1;
        } while (lVar17 < pvVar2[lVar13].rfeaturesnum);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < data->modesnum);
  }
  return iVar11;
}

Assistant:

int vardata_validate(struct vardata *data) {
	int res = 0;
	if (data->validated)
		abort();
	data->validated = 1;
	int i, j;
	for (i = 0; i < data->featuresnum; i++) {
		data->features[i].ifmask = mask_new(data->featuresnum);
		data->features[i].cfmask = mask_new(data->featuresnum);
		mask_set(data->features[i].ifmask, i);
	}
	for (i = 0; i < data->variantsnum; i++) {
		data->variants[i].fmask = mask_new(data->featuresnum);
	}
	for (i = 0; i < data->modesnum; i++) {
		data->modes[i].rfmask = mask_new(data->featuresnum);
	}
	/* implies */
	for (i = 0; i < data->featuresnum; i++) {
		for (j = 0; j < data->features[i].impliesnum; j++) {
			int k = data->features[i].implies[j];
			int l;
			for (l = 0; l < data->featuresnum; l++) {
				if (mask_get(data->features[l].ifmask, i)) {
					mask_or(data->features[l].ifmask, data->features[k].ifmask, data->featuresnum);
				}
			}
		}
	}
	/* conflicts */
	for (i = 0; i < data->featuresnum; i++) {
		for (j = 0; j < data->features[i].conflictsnum; j++) {
			int k = data->features[i].conflicts[j];
			mask_set(data->features[i].cfmask, k);
			mask_set(data->features[k].cfmask, i);
		}
	}
	int p = 1;
	while (p) {
		p = 0;
		for (i = 0; i < data->featuresnum; i++) {
			for (j = 0; j < data->featuresnum; j++) {
				if (mask_get(data->features[i].ifmask, j)) {
					p |= mask_or_r(data->features[i].cfmask, data->features[j].cfmask, data->featuresnum);
				}
			}
		}
	}
	for (i = 0; i < data->featuresnum; i++) {
		if (mask_get(data->features[i].cfmask, i)) {
			fprintf(stderr, "vardata %s: feature %s conflicts with itself!\n", data->name, data->features[i].name);
			res = 1;
		}
	}
	/* variants */
	for (i = 0; i < data->variantsnum; i++) {
		for (j = 0; j < data->variants[i].featuresnum; j++) {
			int k = data->variants[i].features[j];
			mask_or(data->variants[i].fmask, data->features[k].ifmask, data->featuresnum);
		}
	}
	/* variants */
	for (i = 0; i < data->modesnum; i++) {
		for (j = 0; j < data->modes[i].rfeaturesnum; j++) {
			int k = data->modes[i].rfeatures[j];
			mask_set(data->modes[i].rfmask, k);
		}
	}
	return res;
}